

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

QAbstractItemDelegate * __thiscall
QAbstractItemView::itemDelegateForColumn(QAbstractItemView *this,int column)

{
  QObject *pQVar1;
  long in_FS_OFFSET;
  QWeakPointer<QObject> local_38;
  QWeakPointer<QObject> local_28;
  int local_14;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d = (Data *)0x0;
  local_38.value = (QObject *)0x0;
  local_14 = column;
  QMap<int,_QPointer<QAbstractItemDelegate>_>::value
            ((QMap<int,_QPointer<QAbstractItemDelegate>_> *)&local_28,
             (int *)(*(long *)(this + 8) + 0x318),(QPointer<QAbstractItemDelegate> *)&local_14);
  if ((local_28.d == (Data *)0x0) || (pQVar1 = local_28.value, *(int *)(local_28.d + 4) == 0)) {
    pQVar1 = (QObject *)0x0;
  }
  QWeakPointer<QObject>::~QWeakPointer(&local_28);
  QWeakPointer<QObject>::~QWeakPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return (QAbstractItemDelegate *)pQVar1;
}

Assistant:

QAbstractItemDelegate *QAbstractItemView::itemDelegateForColumn(int column) const
{
    Q_D(const QAbstractItemView);
    return d->columnDelegates.value(column, nullptr);
}